

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

void __thiscall
tsbp::TwoStepBranchingProcedure::DomainReductionX
          (TwoStepBranchingProcedure *this,size_t domainReducedItemIndex)

{
  int iVar1;
  size_type __n;
  reference pvVar2;
  Rectangle *pRVar3;
  exception *this_00;
  reference pvVar4;
  double dVar5;
  allocator<unsigned_long> local_b1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  reference local_90;
  value_type *bitsetX;
  size_t j;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  reference local_58;
  value_type *bitsetX_1;
  logic_error local_40 [8];
  logic_error ex;
  Rectangle *item;
  size_t i;
  int reducedDomainThreshold;
  size_t domainReducedItemIndex_local;
  TwoStepBranchingProcedure *this_local;
  
  __n = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size(&this->items);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::reserve(&this->itemSpecificPlacementPointsX,__n);
  iVar1 = (this->container).super_Rectangle.Dx;
  pvVar2 = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator[]
                     (&this->items,domainReducedItemIndex);
  dVar5 = floor((double)(iVar1 - pvVar2->Dx) / 2.0);
  item = (Rectangle *)0x0;
  while( true ) {
    pRVar3 = (Rectangle *)
             std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size(&this->items);
    if (pRVar3 <= item) {
      return;
    }
    pvVar2 = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator[]
                       (&this->items,(size_type)item);
    if ((Rectangle *)(long)pvVar2->InternId != item) break;
    if (item == (Rectangle *)domainReducedItemIndex) {
      iVar1 = (this->container).super_Rectangle.Dx;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&j + 7));
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_78,(long)iVar1,0,(allocator<unsigned_long> *)((long)&j + 7));
      pvVar4 = std::
               vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
               ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                         ((vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                           *)&this->itemSpecificPlacementPointsX,&local_78);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (&local_78);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&j + 7));
      local_58 = pvVar4;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(pvVar4);
      for (bitsetX = (value_type *)0x0; bitsetX <= (value_type *)(long)(int)dVar5;
          bitsetX = (value_type *)
                    ((long)&(bitsetX->m_bits).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1)) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                  (local_58,(size_type)bitsetX,true);
      }
      this->reducedItemDomainX = (long)(int)dVar5;
    }
    else {
      iVar1 = (this->container).super_Rectangle.Dx;
      std::allocator<unsigned_long>::allocator(&local_b1);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_b0,(long)iVar1,0,&local_b1);
      pvVar4 = std::
               vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
               ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                         ((vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                           *)&this->itemSpecificPlacementPointsX,&local_b0);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (&local_b0);
      std::allocator<unsigned_long>::~allocator(&local_b1);
      local_90 = pvVar4;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(pvVar4);
    }
    item = (Rectangle *)((long)&item->X + 1);
  }
  std::logic_error::logic_error(local_40,"Item IDs do not match in TSBP.");
  this_00 = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(this_00,(exception *)local_40);
  __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void TwoStepBranchingProcedure::DomainReductionX(size_t domainReducedItemIndex)
{
    itemSpecificPlacementPointsX.reserve(this->items.size());

    int reducedDomainThreshold = std::floor((this->container.Dx - this->items[domainReducedItemIndex].Dx) / 2.0);

    for (size_t i = 0; i < this->items.size(); i++)
    {
        const Rectangle& item = this->items[i];
        if (item.InternId != i)
        {
            auto ex = std::logic_error("Item IDs do not match in TSBP.");
            throw std::exception(ex);
        }

        if (i == domainReducedItemIndex)
        {
            auto& bitsetX = this->itemSpecificPlacementPointsX.emplace_back(boost::dynamic_bitset<>(this->container.Dx));
            bitsetX.reset();

            for (size_t j = 0; j <= reducedDomainThreshold; j++)
            {
                bitsetX.set(j);
            }

            this->reducedItemDomainX = reducedDomainThreshold;

            continue;
        }

        // TODO: reduce by item.Dy to exclude overlap with the container. Enables simplification of no-overlap checks.
        auto& bitsetX = this->itemSpecificPlacementPointsX.emplace_back(boost::dynamic_bitset<>(this->container.Dx));
        bitsetX.set();
    }
}